

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fsm.cc
# Opt level: O1

vector<kratos::FSMState_*,_std::allocator<kratos::FSMState_*>_> * __thiscall
kratos::FSM::get_all_child_states
          (vector<kratos::FSMState_*,_std::allocator<kratos::FSMState_*>_> *__return_storage_ptr__,
          FSM *this,bool include_extra_state)

{
  _Rb_tree_header *p_Var1;
  _Base_ptr p_Var2;
  pair<kratos::Var_*,_kratos::FSMState_*> *iter;
  undefined1 local_f0 [8];
  unordered_set<kratos::FSMState_*,_std::hash<kratos::FSMState_*>,_std::equal_to<kratos::FSMState_*>,_std::allocator<kratos::FSMState_*>_>
  visited;
  queue<kratos::FSMState_*,_std::deque<kratos::FSMState_*,_std::allocator<kratos::FSMState_*>_>_>
  queue;
  FSMState *local_60;
  vector<std::pair<kratos::Var_*,_kratos::FSMState_*>,_std::allocator<std::pair<kratos::Var_*,_kratos::FSMState_*>_>_>
  next_states;
  FSMState *next_state;
  FSMState *state;
  
  visited._M_h._M_single_bucket = (__node_base_ptr)0x0;
  std::_Deque_base<kratos::FSMState_*,_std::allocator<kratos::FSMState_*>_>::_M_initialize_map
            ((_Deque_base<kratos::FSMState_*,_std::allocator<kratos::FSMState_*>_> *)
             &visited._M_h._M_single_bucket,0);
  (__return_storage_ptr__->
  super__Vector_base<kratos::FSMState_*,_std::allocator<kratos::FSMState_*>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<kratos::FSMState_*,_std::allocator<kratos::FSMState_*>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<kratos::FSMState_*,_std::allocator<kratos::FSMState_*>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_f0 = (undefined1  [8])&visited._M_h._M_rehash_policy._M_next_resize;
  visited._M_h._M_buckets = (__buckets_ptr)0x1;
  visited._M_h._M_bucket_count = 0;
  visited._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  visited._M_h._M_element_count._0_4_ = 0x3f800000;
  visited._M_h._M_rehash_policy._M_max_load_factor = 0.0;
  visited._M_h._M_rehash_policy._4_4_ = 0;
  visited._M_h._M_rehash_policy._M_next_resize = 0;
  p_Var2 = (this->states_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var1 = &(this->states_)._M_t._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)p_Var2 != p_Var1) {
    do {
      local_60 = *(FSMState **)(p_Var2 + 2);
      std::deque<kratos::FSMState*,std::allocator<kratos::FSMState*>>::
      emplace_back<kratos::FSMState*>
                ((deque<kratos::FSMState*,std::allocator<kratos::FSMState*>> *)
                 &visited._M_h._M_single_bucket,&local_60);
      p_Var2 = (_Base_ptr)std::_Rb_tree_increment(p_Var2);
    } while ((_Rb_tree_header *)p_Var2 != p_Var1);
  }
  std::
  _Hashtable<kratos::FSMState_*,_kratos::FSMState_*,_std::allocator<kratos::FSMState_*>,_std::__detail::_Identity,_std::equal_to<kratos::FSMState_*>,_std::hash<kratos::FSMState_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable((_Hashtable<kratos::FSMState_*,_kratos::FSMState_*,_std::allocator<kratos::FSMState_*>,_std::__detail::_Identity,_std::equal_to<kratos::FSMState_*>,_std::hash<kratos::FSMState_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                 *)local_f0);
  std::_Deque_base<kratos::FSMState_*,_std::allocator<kratos::FSMState_*>_>::~_Deque_base
            ((_Deque_base<kratos::FSMState_*,_std::allocator<kratos::FSMState_*>_> *)
             &visited._M_h._M_single_bucket);
  return __return_storage_ptr__;
}

Assistant:

std::vector<FSMState*> FSM::get_all_child_states(bool include_extra_state) const {
    // this is a BFS search
    std::queue<FSMState*> queue;
    std::vector<FSMState*> result;
    std::unordered_set<FSMState*> visited;

    for (auto const& iter : states_) {
        queue.emplace(iter.second.get());
    }
    while (!queue.empty()) {
        auto* const state = queue.front();
        queue.pop();
        if (visited.find(state) != visited.end()) continue;
        visited.emplace(state);
        result.emplace_back(state);
        if (!state) continue;
        auto next_states = state->transitions();
        for (auto const& iter : next_states) {
            auto* next_state = iter.second;
            auto const* fsm = next_state->parent();
            while (fsm && fsm != this) {
                fsm = fsm->parent_fsm();
            }
            if (fsm == this) {
                queue.emplace(next_state);
            } else if (include_extra_state) {
                result.emplace_back(next_state);
            }
        }
    }
    return result;
}